

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoRcc.cxx
# Opt level: O0

bool __thiscall cmQtAutoRcc::Init(cmQtAutoRcc *this,cmMakefile *makefile)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460;
  allocator<char> local_441;
  string local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_420;
  allocator<char> local_401;
  string local_400;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  string local_268;
  allocator<char> local_241;
  undefined1 local_240 [8];
  string error;
  string local_218;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_8991fb9c LogInfoError;
  anon_class_8_1_0d71532a InfoGetConfigList;
  anon_class_16_2_f8a9838d InfoGetConfig;
  anon_class_8_1_ea5e79e8 InfoGetList;
  anon_class_8_1_ea5e79e8 InfoGet;
  cmMakefile *makefile_local;
  cmQtAutoRcc *this_local;
  
  LogInfoError.this = (cmQtAutoRcc *)&InfoGetConfigList;
  local_50.this = this;
  InfoGetConfigList.InfoGetConfig = (anon_class_16_2_f8a9838d *)makefile;
  InfoGetConfig.makefile = (cmMakefile *)this;
  InfoGetConfig.this = (cmQtAutoRcc *)makefile;
  InfoGetList.makefile = makefile;
  psVar2 = cmQtAutoGenerator::InfoFile_abi_cxx11_(&this->super_cmQtAutoGenerator);
  bVar1 = cmMakefile::ReadListFile(makefile,psVar2);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"ARCC_VERBOSITY",&local_c9);
    Init::anon_class_8_1_ea5e79e8::operator()(&local_a8,&InfoGetList,&local_c8);
    cmQtAutoGenerator::Logger::RaiseVerbosity(&this->Logger_,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"ARCC_MULTI_CONFIG",&local_f1);
    bVar1 = cmMakefile::IsOn(makefile,&local_f0);
    this->MultiConfig_ = bVar1;
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"ARCC_BUILD_DIR",&local_139);
    Init::anon_class_8_1_ea5e79e8::operator()(&local_118,&InfoGetList,&local_138);
    std::__cxx11::string::operator=((string *)&this->AutogenBuildDir_,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"ARCC_INCLUDE_DIR",&local_1a9);
      Init::anon_class_16_2_f8a9838d::operator()
                (&local_188,(anon_class_16_2_f8a9838d *)&InfoGetConfigList,&local_1a8);
      std::__cxx11::string::operator=((string *)&this->IncludeDir_,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"ARCC_RCC_EXECUTABLE",
                   (allocator<char> *)(error.field_2._M_local_buf + 0xf));
        Init::anon_class_8_1_ea5e79e8::operator()(&local_1f8,&InfoGetList,&local_218);
        std::__cxx11::string::operator=((string *)&this->RccExecutable_,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator((allocator<char> *)(error.field_2._M_local_buf + 0xf));
        bVar1 = cmFileTime::Load(&this->RccExecutableTime_,&this->RccExecutable_);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a0,"ARCC_RCC_LIST_OPTIONS",&local_2a1);
          Init::anon_class_8_1_ea5e79e8::operator()
                    (&local_280,(anon_class_8_1_ea5e79e8 *)&InfoGetConfig.this,&local_2a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->RccListOptions_,&local_280);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_280);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::allocator<char>::~allocator(&local_2a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"ARCC_LOCK_FILE",&local_2e9);
          Init::anon_class_8_1_ea5e79e8::operator()(&local_2c8,&InfoGetList,&local_2e8);
          std::__cxx11::string::operator=((string *)&this->LockFile_,(string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::allocator<char>::~allocator(&local_2e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_330,"ARCC_SOURCE",&local_331);
          Init::anon_class_8_1_ea5e79e8::operator()(&local_310,&InfoGetList,&local_330);
          psVar2 = &this->QrcFile_;
          std::__cxx11::string::operator=((string *)psVar2,(string *)&local_310);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_330);
          std::allocator<char>::~allocator(&local_331);
          cmsys::SystemTools::GetFilenameName(&local_358,psVar2);
          std::__cxx11::string::operator=((string *)&this->QrcFileName_,(string *)&local_358);
          std::__cxx11::string::~string((string *)&local_358);
          cmsys::SystemTools::GetFilenamePath(&local_378,psVar2);
          std::__cxx11::string::operator=((string *)&this->QrcFileDir_,(string *)&local_378);
          std::__cxx11::string::~string((string *)&local_378);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b8,"ARCC_OUTPUT_CHECKSUM",&local_3b9);
          Init::anon_class_8_1_ea5e79e8::operator()(&local_398,&InfoGetList,&local_3b8);
          std::__cxx11::string::operator=((string *)&this->RccPathChecksum_,(string *)&local_398);
          std::__cxx11::string::~string((string *)&local_398);
          std::__cxx11::string::~string((string *)&local_3b8);
          std::allocator<char>::~allocator(&local_3b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,"ARCC_OUTPUT_NAME",&local_401);
          Init::anon_class_8_1_ea5e79e8::operator()(&local_3e0,&InfoGetList,&local_400);
          std::__cxx11::string::operator=((string *)&this->RccFileName_,(string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_400);
          std::allocator<char>::~allocator(&local_401);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,"ARCC_OPTIONS",&local_441);
          Init::anon_class_8_1_0d71532a::operator()
                    (&local_420,(anon_class_8_1_0d71532a *)&LogInfoError,&local_440);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->Options_,&local_420);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_420);
          std::__cxx11::string::~string((string *)&local_440);
          std::allocator<char>::~allocator(&local_441);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_480,"ARCC_INPUTS",&local_481);
          Init::anon_class_8_1_ea5e79e8::operator()
                    (&local_460,(anon_class_8_1_ea5e79e8 *)&InfoGetConfig.this,&local_480);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->Inputs_,&local_460);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_460);
          std::__cxx11::string::~string((string *)&local_480);
          std::allocator<char>::~allocator(&local_481);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4c8,"ARCC_SETTINGS_FILE",&local_4c9);
          Init::anon_class_16_2_f8a9838d::operator()
                    (&local_4a8,(anon_class_16_2_f8a9838d *)&InfoGetConfigList,&local_4c8);
          std::__cxx11::string::operator=((string *)&this->SettingsFile_,(string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::allocator<char>::~allocator(&local_4c9);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            uVar3 = std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) {
              uVar3 = std::__cxx11::string::empty();
              if ((uVar3 & 1) == 0) {
                uVar3 = std::__cxx11::string::empty();
                if ((uVar3 & 1) == 0) {
                  uVar3 = std::__cxx11::string::empty();
                  if ((uVar3 & 1) == 0) {
                    uVar3 = std::__cxx11::string::empty();
                    if ((uVar3 & 1) == 0) {
                      std::__cxx11::string::operator=
                                ((string *)&this->RccFilePublic_,(string *)&this->AutogenBuildDir_);
                      std::__cxx11::string::operator+=((string *)&this->RccFilePublic_,'/');
                      std::__cxx11::string::operator+=
                                ((string *)&this->RccFilePublic_,(string *)&this->RccPathChecksum_);
                      std::__cxx11::string::operator+=((string *)&this->RccFilePublic_,'/');
                      std::__cxx11::string::operator+=
                                ((string *)&this->RccFilePublic_,(string *)&this->RccFileName_);
                      bVar1 = IsMultiConfig(this);
                      if (bVar1) {
                        psVar2 = &this->RccFileOutput_;
                        std::__cxx11::string::operator=
                                  ((string *)psVar2,(string *)&this->IncludeDir_);
                        std::__cxx11::string::operator+=((string *)psVar2,'/');
                        MultiConfigOutput_abi_cxx11_(&local_5e0,this);
                        std::__cxx11::string::operator+=((string *)psVar2,(string *)&local_5e0);
                        std::__cxx11::string::~string((string *)&local_5e0);
                      }
                      else {
                        std::__cxx11::string::operator=
                                  ((string *)&this->RccFileOutput_,(string *)&this->RccFilePublic_);
                      }
                      this_local._7_1_ = true;
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5b8,"rcc output file missing.",&local_5b9);
                      this_local._7_1_ =
                           Init::anon_class_8_1_8991fb9c::operator()(&local_50,&local_5b8);
                      std::__cxx11::string::~string((string *)&local_5b8);
                      std::allocator<char>::~allocator(&local_5b9);
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_590,"rcc input file missing.",&local_591);
                    this_local._7_1_ =
                         Init::anon_class_8_1_8991fb9c::operator()(&local_50,&local_590);
                    std::__cxx11::string::~string((string *)&local_590);
                    std::allocator<char>::~allocator(&local_591);
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_568,"rcc executable missing.",&local_569);
                  this_local._7_1_ = Init::anon_class_8_1_8991fb9c::operator()(&local_50,&local_568)
                  ;
                  std::__cxx11::string::~string((string *)&local_568);
                  std::allocator<char>::~allocator(&local_569);
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_540,"Autogen build directory missing.",&local_541);
                this_local._7_1_ = Init::anon_class_8_1_8991fb9c::operator()(&local_50,&local_540);
                std::__cxx11::string::~string((string *)&local_540);
                std::allocator<char>::~allocator(&local_541);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_518,"Settings file name missing.",&local_519);
              this_local._7_1_ = Init::anon_class_8_1_8991fb9c::operator()(&local_50,&local_518);
              std::__cxx11::string::~string((string *)&local_518);
              std::allocator<char>::~allocator(&local_519);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4f0,"Lock file name missing.",&local_4f1);
            this_local._7_1_ = Init::anon_class_8_1_8991fb9c::operator()(&local_50,&local_4f0);
            std::__cxx11::string::~string((string *)&local_4f0);
            std::allocator<char>::~allocator(&local_4f1);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_240,"The rcc executable ",&local_241);
          std::allocator<char>::~allocator(&local_241);
          cmQtAutoGen::Quoted(&local_268,&this->RccExecutable_);
          std::__cxx11::string::operator+=((string *)local_240,(string *)&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::operator+=((string *)local_240," does not exist.");
          this_local._7_1_ =
               Init::anon_class_8_1_8991fb9c::operator()(&local_50,(string *)local_240);
          std::__cxx11::string::~string((string *)local_240);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"Include directory empty.",&local_1d1);
        this_local._7_1_ = Init::anon_class_8_1_8991fb9c::operator()(&local_50,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::allocator<char>::~allocator(&local_1d1);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"Build directory empty.",&local_161);
      this_local._7_1_ = Init::anon_class_8_1_8991fb9c::operator()(&local_50,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_161);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"File processing failed.",&local_71);
    this_local._7_1_ = Init::anon_class_8_1_8991fb9c::operator()(&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return this_local._7_1_;
}

Assistant:

bool cmQtAutoRcc::Init(cmMakefile* makefile)
{
  // -- Utility lambdas
  auto InfoGet = [makefile](std::string const& key) {
    return makefile->GetSafeDefinition(key);
  };
  auto InfoGetList =
    [makefile](std::string const& key) -> std::vector<std::string> {
    std::vector<std::string> list;
    cmSystemTools::ExpandListArgument(makefile->GetSafeDefinition(key), list);
    return list;
  };
  auto InfoGetConfig = [makefile,
                        this](std::string const& key) -> std::string {
    const char* valueConf = nullptr;
    {
      std::string keyConf = key;
      keyConf += '_';
      keyConf += InfoConfig();
      valueConf = makefile->GetDefinition(keyConf);
    }
    if (valueConf == nullptr) {
      return makefile->GetSafeDefinition(key);
    }
    return std::string(valueConf);
  };
  auto InfoGetConfigList =
    [&InfoGetConfig](std::string const& key) -> std::vector<std::string> {
    std::vector<std::string> list;
    cmSystemTools::ExpandListArgument(InfoGetConfig(key), list);
    return list;
  };
  auto LogInfoError = [this](std::string const& msg) -> bool {
    std::ostringstream err;
    err << "In " << Quoted(this->InfoFile()) << ":\n" << msg;
    this->Log().Error(GenT::RCC, err.str());
    return false;
  };

  // -- Read info file
  if (!makefile->ReadListFile(InfoFile())) {
    return LogInfoError("File processing failed.");
  }

  // - Configurations
  Logger_.RaiseVerbosity(InfoGet("ARCC_VERBOSITY"));
  MultiConfig_ = makefile->IsOn("ARCC_MULTI_CONFIG");

  // - Directories
  AutogenBuildDir_ = InfoGet("ARCC_BUILD_DIR");
  if (AutogenBuildDir_.empty()) {
    return LogInfoError("Build directory empty.");
  }

  IncludeDir_ = InfoGetConfig("ARCC_INCLUDE_DIR");
  if (IncludeDir_.empty()) {
    return LogInfoError("Include directory empty.");
  }

  // - Rcc executable
  RccExecutable_ = InfoGet("ARCC_RCC_EXECUTABLE");
  if (!RccExecutableTime_.Load(RccExecutable_)) {
    std::string error = "The rcc executable ";
    error += Quoted(RccExecutable_);
    error += " does not exist.";
    return LogInfoError(error);
  }
  RccListOptions_ = InfoGetList("ARCC_RCC_LIST_OPTIONS");

  // - Job
  LockFile_ = InfoGet("ARCC_LOCK_FILE");
  QrcFile_ = InfoGet("ARCC_SOURCE");
  QrcFileName_ = cmSystemTools::GetFilenameName(QrcFile_);
  QrcFileDir_ = cmSystemTools::GetFilenamePath(QrcFile_);
  RccPathChecksum_ = InfoGet("ARCC_OUTPUT_CHECKSUM");
  RccFileName_ = InfoGet("ARCC_OUTPUT_NAME");
  Options_ = InfoGetConfigList("ARCC_OPTIONS");
  Inputs_ = InfoGetList("ARCC_INPUTS");

  // - Settings file
  SettingsFile_ = InfoGetConfig("ARCC_SETTINGS_FILE");

  // - Validity checks
  if (LockFile_.empty()) {
    return LogInfoError("Lock file name missing.");
  }
  if (SettingsFile_.empty()) {
    return LogInfoError("Settings file name missing.");
  }
  if (AutogenBuildDir_.empty()) {
    return LogInfoError("Autogen build directory missing.");
  }
  if (RccExecutable_.empty()) {
    return LogInfoError("rcc executable missing.");
  }
  if (QrcFile_.empty()) {
    return LogInfoError("rcc input file missing.");
  }
  if (RccFileName_.empty()) {
    return LogInfoError("rcc output file missing.");
  }

  // Init derived information
  // ------------------------

  RccFilePublic_ = AutogenBuildDir_;
  RccFilePublic_ += '/';
  RccFilePublic_ += RccPathChecksum_;
  RccFilePublic_ += '/';
  RccFilePublic_ += RccFileName_;

  // Compute rcc output file name
  if (IsMultiConfig()) {
    RccFileOutput_ = IncludeDir_;
    RccFileOutput_ += '/';
    RccFileOutput_ += MultiConfigOutput();
  } else {
    RccFileOutput_ = RccFilePublic_;
  }

  return true;
}